

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int vocgol(voccxdef *ctx,objnum *list,uint *flags,char **wrdlst,int *typlst,int first,int cur,
          int last,int ofword)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  vocwdef *pvVar8;
  long lVar9;
  ushort **ppuVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint p;
  ulong uVar15;
  uint uVar16;
  vocseadef search_ctx;
  uint local_e8;
  char *local_c8;
  vocseadef local_b8 [2];
  
  local_c8 = wrdlst[cur];
  local_e8 = typlst[cur];
  sVar7 = strlen(local_c8);
  if ((local_e8 & 2) == 0 || (local_e8 & 0x44) == 0) {
    uVar14 = 3;
    bVar4 = false;
    if (((local_e8 & 4) == 0) && (uVar14 = 0x31, -1 < (char)local_e8)) {
      bVar11 = ofword + -1 == cur || cur + 1 == last;
      uVar14 = 4;
      bVar6 = false;
    }
    else {
      bVar6 = false;
LAB_001fead5:
      bVar4 = false;
      bVar11 = false;
    }
  }
  else {
    if (ofword + -1 == cur || cur + 1 == last) {
      uVar14 = local_e8 & 4 ^ 7;
      bVar6 = true;
      goto LAB_001fead5;
    }
    if (((ofword + -2 == cur || cur + 2 == last) && (cVar2 = *wrdlst[cur + 1], -1 < (long)cVar2)) &&
       (ppuVar10 = __ctype_b_loc(), (*(byte *)((long)*ppuVar10 + (long)cVar2 * 2 + 1) & 8) != 0)) {
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    bVar6 = false;
    uVar14 = 4;
    bVar11 = false;
  }
  local_e8 = local_e8 & 0x40;
  if ((ctx->voccxflg & 4) != 0) {
    sprintf((char *)local_b8,"... %s (treating as %s%s)\\n",local_c8);
    outformat((char *)local_b8);
  }
  uVar13 = 0;
  if (uVar14 != 0x31) {
    uVar13 = 0;
LAB_001febc9:
    do {
      bVar5 = bVar6;
      bVar3 = bVar11;
      p = uVar14;
      pvVar8 = vocffw(ctx,local_c8,(int)sVar7,(char *)0x0,0,p,local_b8);
      if (pvVar8 != (vocwdef *)0x0) {
        uVar12 = (uint)(p == 7) * 0x40;
        uVar16 = uVar12 + 0x1000;
        if (!bVar3) {
          uVar16 = uVar12;
        }
        if (p != 4) {
          uVar16 = uVar12;
        }
        do {
          lVar9 = (long)(int)uVar13;
          list[lVar9] = pvVar8->vocwobj;
          flags[lVar9] = uVar16;
          if ((int)sVar7 < (int)(uint)(local_b8[0].v)->voclen) {
            pbVar1 = (byte *)((long)flags + lVar9 * 4 + 1);
            *pbVar1 = *pbVar1 | 0x20;
          }
          uVar14 = uVar13 + 1;
          if (0 < (int)uVar13) {
            uVar15 = 0;
            do {
              if ((list[uVar15] == list[lVar9]) && (uVar14 = uVar13, flags[uVar15] == flags[lVar9]))
              break;
              uVar15 = uVar15 + 1;
              uVar14 = uVar13 + 1;
            } while (uVar13 != uVar15);
          }
          uVar13 = uVar14;
          if (199 < (int)uVar13) {
            vocerr(ctx,3,"The word \"%s\" refers to too many objects.",local_c8);
            uVar13 = 0xffffffff;
            goto LAB_001fed88;
          }
          pvVar8 = vocfnw(ctx,local_b8);
        } while (pvVar8 != (vocwdef *)0x0);
      }
      bVar11 = bVar3;
      bVar6 = bVar5;
      if ((bVar4) && (p == 4)) {
        bVar4 = false;
        uVar14 = 3;
        goto LAB_001febc9;
      }
      if ((local_e8 != 0) && (p != 7)) {
        local_e8 = 0;
        uVar14 = 7;
        goto LAB_001febc9;
      }
      if (bVar5) {
        uVar14 = 4;
        bVar11 = true;
        bVar6 = false;
        if (p != 4) goto LAB_001febc9;
      }
      cVar2 = *local_c8;
      if ((((long)cVar2 < 0) || (ppuVar10 = __ctype_b_loc(), p != 4)) ||
         (((*ppuVar10)[cVar2] & 0x800) == 0)) goto LAB_001fed5f;
      sVar7 = 1;
      local_c8 = "#";
      uVar14 = 4;
      bVar11 = bVar3;
      bVar6 = bVar5;
      if (first + 1 == last) goto LAB_001fed5f;
    } while( true );
  }
LAB_001fed88:
  *list = 0xffff;
  return uVar13;
LAB_001fed5f:
  list = list + (int)uVar13;
  goto LAB_001fed88;
}

Assistant:

static int vocgol(voccxdef *ctx, objnum *list, uint *flags, char **wrdlst,
                  int *typlst, int first, int cur, int last, int ofword)
{
    char      *wrd;
    int        typ;
    vocwdef   *v;
    int        cnt;
    int        len;
    vocseadef  search_ctx;
    int        try_plural;
    int        try_noun_before_num;
    int        try_endadj;
    int        trying_endadj;
    int        wrdtyp;

    /* get the current word and its type */
    wrd = wrdlst[cur];
    typ = typlst[cur];

    /* get the length of the word */
    len = strlen(wrd);

    /*
     *   Get word type: figure out the correct part of speech, given by
     *   context, for a given word.  If it could count as only a
     *   noun/plural or only an adjective, we use that.  If it could count
     *   as either a noun/plural or an adjective, we will treat it as a
     *   noun/plural if it is the last word in the name or the last word
     *   before "of", otherwise as an adjective.
     *   
     *   If the word is unknown, treat it as a noun or adjective - treat
     *   it as part of the current noun phrase.  One unknown word renders
     *   the whole noun phrase unknown.  
     */
    try_plural = (typ & VOCT_PLURAL);

    /* presume we won't retry this word as an adjective */
    try_endadj = FALSE;

    /* presume we won't retry this as a noun before a number */
    try_noun_before_num = FALSE;

    /* we're not yet trying with adjective-at-end */
    trying_endadj = FALSE;

    /* check to see what parts of speech are defined for this word */
    if ((typ & (VOCT_NOUN | VOCT_PLURAL)) && (typ & VOCT_ADJ))
    {
        /*
         *   This can be either an adjective or a plural/noun.  If this is
         *   the last word in the noun phrase, treat it as a noun/plural if
         *   possible.  Otherwise, treat it as an adjective.  
         */
        if (cur + 1 == last || cur == ofword - 1)
        {
            /* 
             *   This is the last word in the entire phrase, or the last word
             *   before an 'of' (which makes it the last word of its
             *   subphrase).  Treat it as a noun if possible, otherwise as a
             *   plural 
             */
            wrdtyp = ((typ & VOCT_NOUN) ? PRP_NOUN : PRP_PLURAL);

            /* 
             *   If this can be an adjective, too, make a note to come back
             *   and try it again as an adjective.  We prefer not to end a
             *   noun phrase with an adjective, but we allow it, since it's
             *   often convenient to abbreviate a noun phrase to just the
             *   adjectives (as in TAKE RED, where there's only one object
             *   nearby to which RED applies).  
             */
            if ((typ & VOCT_ADJ) != 0)
                try_endadj = TRUE;
        }
        else if ((cur + 2 == last || cur == ofword - 2)
                 && vocisdigit(wrdlst[cur+1][0]))
        {
            /*
             *   This is the second-to-last word, and the last word is
             *   numeric.  In this case, try this word as BOTH a noun and an
             *   adjective.  Try it as an adjective first, but make a note to
             *   go back and try it again as a noun. 
             */
            wrdtyp = PRP_ADJ;
            try_noun_before_num = TRUE;
        }
        else
        {
            /* 
             *   This isn't the last word, so it can only be an adjective.
             *   Look at it only as an adjective.  
             */
            wrdtyp = PRP_ADJ;
        }
    }
    else if (typ & VOCT_NOUN)
        wrdtyp = PRP_NOUN;
    else if (typ & VOCT_UNKNOWN)
        wrdtyp = PRP_UNKNOWN;
    else
    {
        /* it's just an adjective */
        wrdtyp = PRP_ADJ;

        /* 
         *   if this is the last word in the phrase, flag it as an ending
         *   adjective 
         */
        if (cur + 1 == last || cur == ofword - 1)
            trying_endadj = TRUE;
    }

    /* display debugger information if appropriate */
    if (ctx->voccxflg & VOCCXFDBG)
    {
        char buf[128];

        sprintf(buf, "... %s (treating as %s%s)\\n", wrd,
                (wrdtyp == PRP_ADJ ? "adjective" :
                 wrdtyp == PRP_NOUN ? "noun" :
                 wrdtyp == PRP_INVALID ? "unknown" : "plural"),
                (wrdtyp == PRP_NOUN && try_plural ? " + plural" : ""));
        tioputs(ctx->vocxtio, buf);
    }

    /* if this is an unknown word, it doesn't have any objects */
    if (wrdtyp == PRP_UNKNOWN)
    {
        list[0] = MCMONINV;
        return 0;
    }

    /* we have nothing in the list yet */
    cnt = 0;

add_words:
    for (v = vocffw(ctx, wrd, len, (char *)0, 0, wrdtyp, &search_ctx)
         ; v != 0 ; v = vocfnw(ctx, &search_ctx))
    {
        int i;

        /* add the matching object to the output list */
        list[cnt] = v->vocwobj;

        /* clear the flags */
        flags[cnt] = 0;

        /* set the PLURAL flag if this is the plural vocabulary usage */
        if (wrdtyp == PRP_PLURAL)
            flags[cnt] |= VOCS_PLURAL;

        /* set the ADJECTIVE AT END flag if appropriate */
        if (wrdtyp == PRP_ADJ && trying_endadj)
            flags[cnt] |= VOCS_ENDADJ;

        /* 
         *   if this is not an exact match for the word, but is merely a
         *   long-enough leading substring, flag it as truncated 
         */
        if (len < search_ctx.v->voclen)
            flags[cnt] |= VOCS_TRUNC;

        /* count the additional word in the list */
        ++cnt;

        /* 
         *   if this object is already in the list with the same flags,
         *   don't add it again 
         */
        for (i = 0 ; i < cnt - 1 ; ++i)
        {
            /* check for an identical entry */
            if (list[i] == list[cnt-1] && flags[i] == flags[cnt-1])
            {
                /* take it back out of the list */
                --cnt;

                /* no need to continue looking for the duplicate */
                break;
            }
        }

        /* make sure we haven't overflowed the list */
        if (cnt >= VOCMAXAMBIG)
        {
            vocerr(ctx, VOCERR(3),
                   "The word \"%s\" refers to too many objects.", wrd);
            list[0] = MCMONINV;
            return -1;
        }
    }

    /*
     *   if we want to go back and try the word again as a noun before a
     *   number (as in "button 5"), do so now 
     */
    if (try_noun_before_num && wrdtyp == PRP_ADJ)
    {
        /* change the word type to noun */
        wrdtyp = PRP_NOUN;

        /* don't try this again */
        try_noun_before_num = FALSE;

        /* add the words for the noun usage */
        goto add_words;
    }

    /*
     *   if we're interpreting the word as a noun, and the word can be a
     *   plural, add in the plural interpretation as well 
     */
    if (try_plural && wrdtyp != PRP_PLURAL)
    {
        /* change the word type to plural */
        wrdtyp = PRP_PLURAL;

        /* don't try plurals again */
        try_plural = FALSE;

        /* add the words for the plural usage */
        goto add_words;
    }

    /* 
     *   if this was the last word in the phrase, and it could have been
     *   an adjective, try it again as an adjective 
     */
    if (try_endadj && wrdtyp != PRP_ADJ)
    {
        /* change the word type to adjective */
        wrdtyp = PRP_ADJ;

        /* note that we're retrying as an adjective */
        trying_endadj = TRUE;

        /* don't try this again */
        try_endadj = FALSE;

        /* add the words for the adjective usage */
        goto add_words;
    }

    /*
     *   If we're interpreting the word as an adjective, and it's
     *   numeric, include objects with "#" in their adjective list --
     *   these objects allow arbitrary numbers as adjectives.  Don't do
     *   this if there's only the one word.  
     */
    if (vocisdigit(wrd[0]) && wrdtyp == PRP_ADJ && first + 1 != last)
    {
        wrd = "#";
        len = 1;
        goto add_words;
    }

    list[cnt] = MCMONINV;
    return cnt;
}